

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal.cpp
# Opt level: O1

void unodb::detail::dump_byte(ostream *os,byte byte)

{
  long lVar1;
  long lVar2;
  ostream oVar3;
  ostream *poVar4;
  ostream *poVar5;
  char local_21;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_21,1);
  lVar1 = *(long *)poVar4;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar5 = poVar4 + lVar1;
  if (poVar4[lVar1 + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = oVar3;
    poVar5[0xe1] = (ostream)0x1;
  }
  poVar5[0xe0] = (ostream)0x30;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump_byte(std::ostream &os,
                                                   std::byte byte) {
  os << ' ' << std::hex << std::setfill('0') << std::setw(2)
     << static_cast<unsigned>(byte) << std::dec;
}